

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNStm * __thiscall
CTcParser::parse_default(CTcParser *this,int *err,CTPNStmSwitch *enclosing_switch)

{
  int iVar1;
  tc_toktyp_t tVar2;
  CTcTokenizer *this_00;
  CTPNStm *stm_00;
  CTPNStmSwitchBase *in_RDX;
  undefined8 in_RDI;
  CTPNStmDefault *default_stm;
  CTPNStm *stm;
  CTcParser *in_stack_00000048;
  int errnum;
  CTcTokenizer *this_01;
  CTcTokenizer *in_stack_ffffffffffffffc8;
  
  errnum = (int)((ulong)in_RDI >> 0x20);
  this_00 = (CTcTokenizer *)CTcPrsAllocObj::operator_new(0x2bdec6);
  CTPNStmDefault::CTPNStmDefault((CTPNStmDefault *)this_00);
  this_01 = this_00;
  iVar1 = CTPNStmSwitchBase::get_has_default(in_RDX);
  if (iVar1 != 0) {
    CTcTokenizer::log_error(0x2b4e);
  }
  CTPNStmSwitchBase::set_has_default(in_RDX);
  tVar2 = CTcTokenizer::next(in_stack_ffffffffffffffc8);
  if (tVar2 == TOKT_COLON) {
    CTcTokenizer::next(in_stack_ffffffffffffffc8);
  }
  else {
    CTcTokenizer::log_error_curtok(this_01,errnum);
  }
  stm_00 = parse_stm(in_stack_00000048,(int *)this,(CTPNStmSwitch *)err,enclosing_switch._4_4_);
  CTPNStmDefaultBase::set_stm((CTPNStmDefaultBase *)this_00,stm_00);
  return (CTPNStm *)this_00;
}

Assistant:

CTPNStm *CTcParser::parse_default(int *err, CTPNStmSwitch *enclosing_switch)
{
    CTPNStm *stm;
    CTPNStmDefault *default_stm;

    /* create the 'default' statement node */
    default_stm = new CTPNStmDefault();

    /* 
     *   if the enclosing 'switch' already has a 'default' label, it's an
     *   error; continue anyway, since we still want to finish parsing the
     *   syntax 
     */
    if (enclosing_switch->get_has_default())
        G_tok->log_error(TCERR_DEFAULT_REDEF);

    /* mark the switch as having a 'default' case */
    enclosing_switch->set_has_default();

    /* skip the 'default' node, and require the colon */
    if (G_tok->next() == TOKT_COLON)
    {
        /* skip the colon */
        G_tok->next();
    }
    else
    {
        /* 
         *   log an error, and keep going, assuming that the token was
         *   accidentally omitted 
         */
        G_tok->log_error_curtok(TCERR_REQ_DEFAULT_COLON);
    }

    /* 
     *   parse the labeled statement - it's directly within this same
     *   enclosing switch, because a 'default' label doesn't create a new
     *   expression nesting level (hence another 'case' label immediately
     *   following without an intervening statement is perfectly valid) 
     */
    stm = parse_stm(err, enclosing_switch, FALSE);

    /* set the statement in the 'default' node */
    default_stm->set_stm(stm);

    /* return the 'default' node */
    return default_stm;
}